

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool __thiscall cppcms::xss::uri_parser::pct_encoded(uri_parser *this)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = this->begin_;
  if ((long)this->end_ - (long)pcVar1 < 3) {
    return false;
  }
  if (((*pcVar1 == '%') && (bVar2 = is_hex(pcVar1[1]), bVar2)) &&
     (bVar2 = is_hex(this->begin_[2]), bVar2)) {
    this->begin_ = this->begin_ + 3;
    return true;
  }
  return false;
}

Assistant:

bool pct_encoded()
		{
			if(end_ - begin_ >=3 && begin_[0]=='%' && is_hex(begin_[1]) && is_hex(begin_[2])) {
				begin_+=3;
				return true;
			}
			return false;
		}